

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrc.cc
# Opt level: O0

void __thiscall
RRC::work(RRC *this,
         shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         *qin,shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
              *qout)

{
  bool bVar1;
  element_type *peVar2;
  pointer pvVar3;
  runtime_error *prVar4;
  size_type sVar5;
  size_type sVar6;
  char (*in_RDX) [2];
  int __fd;
  char (*in_RSI) [93];
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *in_RDI;
  complex<float> *fo;
  complex<float> *fi;
  size_type nsamples;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  output;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  input;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *in_stack_fffffffffffffe48;
  __normal_iterator<const_std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *in_stack_fffffffffffffe50;
  __normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *in_stack_fffffffffffffe58;
  pointer in_stack_fffffffffffffe60;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *in_stack_fffffffffffffe68;
  const_iterator in_stack_fffffffffffffe70;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *in_stack_fffffffffffffe78;
  const_iterator __first;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  *in_stack_fffffffffffffe80;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *in_stack_fffffffffffffe90;
  RRC *this_00;
  __normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  in_stack_fffffffffffffe98;
  __normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
  in_stack_fffffffffffffea0;
  const_iterator __position;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *this_01;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  SamplePublisher *in_stack_fffffffffffffee0;
  undefined1 local_c0 [48];
  complex<float> *local_90;
  unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> local_88;
  complex<float> *local_80;
  complex<float> *local_78;
  undefined1 local_65;
  undefined4 local_64;
  string local_60 [32];
  size_type local_40;
  undefined4 local_30;
  complex<float> in_stack_ffffffffffffffe0;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *args;
  
  args = in_RDI;
  peVar2 = std::
           __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b9d9c);
  __fd = (int)peVar2;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
            (in_stack_fffffffffffffe78);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                      *)0x1b9db9);
  if (bVar1) {
    std::
    __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b9e0a);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
              (in_RDI);
    pvVar3 = std::
             unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
             ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                           *)0x1b9e29);
    local_40 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size(pvVar3)
    ;
    if (local_40 % (ulong)(long)(in_RDI->m_).super___mutex_base._M_mutex.__data.__lock != 0) {
      local_65 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_64 = 0x93;
      util::str<char[53],char[93],char[2],int>
                ((char (*) [53])args,in_RSI,in_RDX,(int *)in_stack_ffffffffffffffe0._M_value);
      std::runtime_error::runtime_error(prVar4,local_60);
      local_65 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x1b9f45);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
               in_stack_fffffffffffffe70._M_current,(size_type)in_stack_fffffffffffffe68);
    this_01 = (Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
              ((long)&(in_RDI->m_).super___mutex_base._M_mutex + 0x20);
    local_78 = (complex<float> *)
               std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::end
                         (in_stack_fffffffffffffe48);
    __gnu_cxx::
    __normal_iterator<std::complex<float>const*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>
    ::__normal_iterator<std::complex<float>*>
              (in_stack_fffffffffffffe50,
               (__normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)in_stack_fffffffffffffe48);
    __position._M_current = (complex<float> *)&stack0xffffffffffffffe0;
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x1b9faf);
    local_80 = (complex<float> *)
               std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::begin
                         (in_stack_fffffffffffffe48);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x1b9fc9);
    local_88._M_t.super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t
    .super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
    super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
         (__uniq_ptr_data<SamplePublisher,_std::default_delete<SamplePublisher>,_true,_true>)
         std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::end
                   (in_stack_fffffffffffffe48);
    local_90 = (complex<float> *)
               std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
               insert<__gnu_cxx::__normal_iterator<std::complex<float>*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>,void>
                         (in_stack_fffffffffffffe90,__position,in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98);
    sVar5 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size
                      ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                       &(in_RDI->m_).super___mutex_base._M_mutex.__data.__list.__next);
    pvVar3 = std::
             unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
             ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                           *)0x1ba032);
    sVar6 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size(pvVar3);
    if (sVar5 != sVar6 + 0x1f) {
      local_c0[0xb] = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._12_4_ = 0x96;
      util::str<char[60],char[93],char[2],int>
                ((char (*) [60])args,in_RSI,in_RDX,(int *)in_stack_ffffffffffffffe0._M_value);
      std::runtime_error::runtime_error(prVar4,(string *)(local_c0 + 0x10));
      local_c0[0xb] = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar2 = std::
             __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ba152);
    this_00 = (RRC *)local_c0;
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)in_stack_fffffffffffffe50,
                 (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)in_stack_fffffffffffffe48);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
              (in_stack_fffffffffffffe80,
               (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                *)in_stack_fffffffffffffe78);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_fffffffffffffe60);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)0x1ba1a0);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x1ba1b5);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)0x1ba1bd);
    work(this_00,(size_t)peVar2,(complex<float> *)in_stack_fffffffffffffe80,
         (complex<float> *)in_stack_fffffffffffffe78);
    __first._M_current = (complex<float> *)((long)&(in_RDI->m_).super___mutex_base._M_mutex + 0x20);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::begin
              (in_stack_fffffffffffffe48);
    __gnu_cxx::
    __normal_iterator<std::complex<float>const*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>
    ::__normal_iterator<std::complex<float>*>
              (in_stack_fffffffffffffe50,
               (__normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)in_stack_fffffffffffffe48);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::end
              (in_stack_fffffffffffffe48);
    __gnu_cxx::
    __normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
    ::operator-(in_stack_fffffffffffffe58,(difference_type)in_stack_fffffffffffffe50);
    __gnu_cxx::
    __normal_iterator<std::complex<float>const*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>
    ::__normal_iterator<std::complex<float>*>
              (in_stack_fffffffffffffe50,
               (__normal_iterator<std::complex<float>_*,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)in_stack_fffffffffffffe48);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::erase
              (in_stack_fffffffffffffe68,__first,in_stack_fffffffffffffe70);
    sVar5 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size
                      ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                       &(in_RDI->m_).super___mutex_base._M_mutex.__data.__list.__next);
    if (sVar5 != 0x1f) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      util::str<char[44],char[93],char[2],int>
                ((char (*) [44])args,in_RSI,in_RDX,(int *)in_stack_ffffffffffffffe0._M_value);
      std::runtime_error::runtime_error(prVar4,(string *)&stack0xfffffffffffffee0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)
                       0x1ba3bd);
    if (bVar1) {
      in_stack_fffffffffffffe60 =
           std::unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>::operator->
                     ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)0x1ba3d4
                     );
      std::
      unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
      ::operator*((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_fffffffffffffe50);
      SamplePublisher::publish
                (in_stack_fffffffffffffee0,
                 (Samples *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
    peVar2 = std::
             __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ba40d);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)peVar2,
                 (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)in_stack_fffffffffffffe48);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
              (this_01,(unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                        *)__position._M_current);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_fffffffffffffe60);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_fffffffffffffe60);
    local_30 = 0;
  }
  else {
    peVar2 = std::
             __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b9dca);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::close
              (peVar2,__fd);
    local_30 = 1;
  }
  std::
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                 *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

void RRC::work(
    const std::shared_ptr<Queue<Samples> >& qin,
    const std::shared_ptr<Queue<Samples> >& qout) {
  auto input = qin->popForRead();
  if (!input) {
    qout->close();
    return;
  }

  auto output = qout->popForWrite();
  auto nsamples = input->size();
  ASSERT((nsamples % decimation_) == 0);
  output->resize(nsamples / decimation_);
  tmp_.insert(tmp_.end(), input->begin(), input->end());
  ASSERT(tmp_.size() == input->size() + NTAPS);

  // Return read buffer (it has been copied into tmp_)
  qin->pushRead(std::move(input));

  // Do actual work
  std::complex<float>* fi = tmp_.data();
  std::complex<float>* fo = output->data();
  work(nsamples, fi, fo);

  // Keep final NTAPS samples around
  tmp_.erase(tmp_.begin(), tmp_.end() - NTAPS);
  ASSERT(tmp_.size() == NTAPS);

  // Publish output if applicable
  if (samplePublisher_) {
    samplePublisher_->publish(*output);
  }

  // Return output buffer
  qout->pushWrite(std::move(output));
}